

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_roundtrip_test.cxx
# Opt level: O2

void test_linear_roundtrip<cryptox::symmetric_algorithm<&EVP_des_cfb64>>(size_t buffer_size)

{
  ulong uVar1;
  buffer_type master;
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_> endec;
  allocator_type local_d9;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  vector<unsigned_char,std::allocator<unsigned_char>> local_c0 [24];
  endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_> local_a8;
  
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_>::
  endec_pair_tester(&local_a8);
  cryptox::detail::make_random_vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8,0x1000);
  for (uVar1 = 0;
      uVar1 <= (ulong)((long)local_d8._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_d8._M_impl.super__Vector_impl_data._M_start); uVar1 = uVar1 + 1) {
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (local_c0,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                         )local_d8._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(local_d8._M_impl.super__Vector_impl_data._M_start + uVar1),&local_d9);
    cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>>::
    check_roundtrip<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>> *)&local_a8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_c0);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_d8);
  cryptox::tests::endec_pair_tester<cryptox::symmetric_algorithm<&EVP_des_cfb64>_>::
  ~endec_pair_tester(&local_a8);
  return;
}

Assistant:

static void test_linear_roundtrip(const size_t buffer_size = 4096) {
	cryptox::tests::endec_pair_tester<Algorithm> endec;

	typedef std::vector<std::uint8_t> buffer_type;

	using cryptox::detail::make_random_vector;
	const buffer_type master = make_random_vector(buffer_size);
	for (int i=0; i<=master.size(); ++i) {
		endec.check_roundtrip(
			buffer_type(master.begin(), master.begin() + i)
		);
	}
}